

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3PagerSavepoint(Pager *pPager,int op,int iSavepoint)

{
  PagerSavepoint *pPVar1;
  sqlite3_io_methods *psVar2;
  Wal *pWVar3;
  u32 *puVar4;
  PgHdr *pPVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  u32 uVar11;
  u32 uVar12;
  u32 uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  PgHdr *pPVar17;
  Pgno *pPVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  PagerSavepoint *pPVar24;
  ulong uVar25;
  long lVar26;
  i64 *piVar27;
  long in_FS_OFFSET;
  Bitvec *local_60;
  ulong local_48;
  u32 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar15 = pPager->errCode;
  if (pPager->errCode != 0) goto LAB_00137005;
  iVar14 = pPager->nSavepoint;
  iVar19 = 0;
  iVar15 = 0;
  if (iVar14 <= iSavepoint) goto LAB_00137005;
  iVar20 = (uint)(op != 1) + iSavepoint;
  lVar22 = (long)iVar20;
  lVar26 = lVar22 * 0x38 + 0x10;
  for (lVar23 = lVar22; lVar23 < iVar14; lVar23 = lVar23 + 1) {
    sqlite3BitvecDestroy(*(Bitvec **)((long)pPager->aSavepoint->aWalData + lVar26 + -0x24));
    iVar14 = pPager->nSavepoint;
    lVar26 = lVar26 + 0x38;
  }
  pPager->nSavepoint = iVar20;
  iVar15 = iVar19;
  if (op == 1) {
    pPVar1 = pPager->aSavepoint;
    if (pPVar1[lVar22].bTruncateOnRelease != 0) {
      psVar2 = pPager->sjfd->pMethods;
      if (psVar2 != (sqlite3_io_methods *)0x0) {
        iVar15 = 0;
        if (psVar2 == &MemJournalMethods) {
          iVar15 = memjrnlTruncate(pPager->sjfd,
                                   (ulong)pPVar1[lVar22].iSubRec * (pPager->pageSize + 4));
        }
        pPager->nSubRec = pPVar1[lVar22].iSubRec;
      }
    }
    goto LAB_00137005;
  }
  if ((pPager->pWal == (Wal *)0x0) && (pPager->jfd->pMethods == (sqlite3_io_methods *)0x0))
  goto LAB_00137005;
  if (iVar20 == 0) {
LAB_00136d8a:
    pPVar18 = &pPager->dbOrigSize;
    bVar10 = true;
    local_60 = (Bitvec *)0x0;
    pPVar24 = (PagerSavepoint *)0x0;
  }
  else {
    pPVar1 = pPager->aSavepoint;
    pPVar24 = pPVar1 + lVar22 + -1;
    if (pPVar24 == (PagerSavepoint *)0x0) goto LAB_00136d8a;
    local_60 = sqlite3BitvecCreate(pPVar1[lVar22 + -1].nOrig);
    if (local_60 == (Bitvec *)0x0) {
      iVar15 = 7;
      goto LAB_00137005;
    }
    pPVar18 = &pPVar1[lVar22 + -1].nOrig;
    bVar10 = false;
  }
  pPager->dbSize = *pPVar18;
  pPager->changeCountDone = pPager->tempFile;
  if (bVar10) {
    pWVar3 = pPager->pWal;
    if (pWVar3 != (Wal *)0x0) {
      pPager->dbSize = pPager->dbOrigSize;
      if (pWVar3->writeLock == '\0') {
        iVar15 = 0;
      }
      else {
        uVar16 = (pWVar3->hdr).mxFrame;
        puVar4 = *pWVar3->apWiData;
        uVar12 = puVar4[0];
        uVar13 = puVar4[1];
        uVar6 = *(undefined8 *)(puVar4 + 2);
        uVar11 = puVar4[5];
        uVar7 = *(undefined8 *)(puVar4 + 6);
        uVar8 = *(undefined8 *)(puVar4 + 8);
        uVar9 = *(undefined8 *)(puVar4 + 10);
        (pWVar3->hdr).mxFrame = puVar4[4];
        (pWVar3->hdr).nPage = uVar11;
        *(undefined8 *)(pWVar3->hdr).aFrameCksum = uVar7;
        (pWVar3->hdr).iVersion = uVar12;
        (pWVar3->hdr).unused = uVar13;
        (pWVar3->hdr).iChange = (int)uVar6;
        (pWVar3->hdr).isInit = (char)((ulong)uVar6 >> 0x20);
        (pWVar3->hdr).bigEndCksum = (char)((ulong)uVar6 >> 0x28);
        (pWVar3->hdr).szPage = (short)((ulong)uVar6 >> 0x30);
        *(undefined8 *)(pWVar3->hdr).aSalt = uVar8;
        *(undefined8 *)(pWVar3->hdr).aCksum = uVar9;
        iVar15 = 0;
        for (uVar21 = (pWVar3->hdr).mxFrame + 0x1001; (iVar15 == 0 && (uVar21 - 0x1000 <= uVar16));
            uVar21 = uVar21 + 1) {
          if (((ulong)uVar21 + 0xffffffff021 & 0xffffffff000) == 0) {
            pPVar18 = *pWVar3->apWiData + (ulong)(uVar21 - 0x1000) + 0x21;
          }
          else {
            pPVar18 = (Pgno *)((ulong)((uVar21 - 0xfdf & 0xfff) << 2) +
                              (long)pWVar3->apWiData[(int)((ulong)uVar21 + 0xffffffff021 >> 0xc)]);
          }
          iVar15 = pagerUndoCallback(pPager,*pPVar18);
        }
        if (uVar16 != (pWVar3->hdr).mxFrame) {
          walCleanupHash(pWVar3);
        }
      }
      pPVar17 = sqlite3PcacheDirtyList(pPager->pPCache);
      while ((pPVar17 != (PgHdr *)0x0 && (iVar15 == 0))) {
        pPVar5 = pPVar17->pDirty;
        iVar15 = pagerUndoCallback(pPager,pPVar17->pgno);
        pPVar17 = pPVar5;
      }
      goto LAB_00137005;
    }
    lVar26 = pPager->journalOff;
LAB_00136ef8:
    pPager->journalOff = 0;
    iVar15 = 0;
  }
  else {
    piVar27 = &pPager->journalOff;
    lVar26 = pPager->journalOff;
    if (pPager->pWal != (Wal *)0x0) goto LAB_00136ef8;
    lVar23 = pPVar24->iHdrOffset;
    if (pPVar24->iHdrOffset == 0) {
      lVar23 = lVar26;
    }
    *piVar27 = pPVar24->iOffset;
    iVar15 = 0;
    while (iVar15 == 0) {
      if (lVar23 <= *piVar27) {
        iVar15 = 0;
        break;
      }
      iVar15 = pager_playback_one_page(pPager,piVar27,local_60,1,1);
    }
  }
  piVar27 = &pPager->journalOff;
  while ((iVar15 == 0 && (*piVar27 < lVar26))) {
    local_48 = local_48 & 0xffffffff00000000;
    iVar15 = readJournalHdr(pPager,0,lVar26,(u32 *)&local_48,&local_3c);
    uVar16 = (uint)local_48;
    if ((uint)local_48 == 0) {
      lVar23 = (ulong)pPager->sectorSize + pPager->journalHdr;
      uVar16 = 0;
      if (lVar23 == pPager->journalOff) {
        uVar16 = (uint)((lVar26 - lVar23) / (pPager->pageSize + 8));
      }
    }
    uVar21 = 0;
    while (((iVar15 == 0 && (uVar21 < uVar16)) && (*piVar27 < lVar26))) {
      iVar15 = pager_playback_one_page(pPager,piVar27,local_60,1,1);
      uVar21 = uVar21 + 1;
    }
  }
  if (!bVar10) {
    uVar25 = (ulong)pPVar24->iSubRec;
    local_48 = (pPager->pageSize + 4) * uVar25;
    pWVar3 = pPager->pWal;
    if (pWVar3 != (Wal *)0x0) {
      if (pPVar24->aWalData[3] == pWVar3->nCkpt) {
        uVar16 = pPVar24->aWalData[0];
      }
      else {
        pPVar24->aWalData[0] = 0;
        pPVar24->aWalData[3] = pWVar3->nCkpt;
        uVar16 = 0;
      }
      iVar15 = 0;
      if (uVar16 < (pWVar3->hdr).mxFrame) {
        (pWVar3->hdr).mxFrame = uVar16;
        (pWVar3->hdr).aFrameCksum[0] = pPVar24->aWalData[1];
        (pWVar3->hdr).aFrameCksum[1] = pPVar24->aWalData[2];
        walCleanupHash(pWVar3);
        uVar25 = (ulong)pPVar24->iSubRec;
      }
    }
    for (; (iVar15 == 0 && ((uint)uVar25 < pPager->nSubRec)); uVar25 = (ulong)((uint)uVar25 + 1)) {
      iVar15 = pager_playback_one_page(pPager,(i64 *)&local_48,local_60,0,1);
    }
  }
  sqlite3BitvecDestroy(local_60);
  if (iVar15 == 0) {
    *piVar27 = lVar26;
    iVar15 = 0;
  }
LAB_00137005:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar15;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerSavepoint(Pager *pPager, int op, int iSavepoint){
  int rc = pPager->errCode;

#ifdef SQLITE_ENABLE_ZIPVFS
  if( op==SAVEPOINT_RELEASE ) rc = SQLITE_OK;
#endif

  assert( op==SAVEPOINT_RELEASE || op==SAVEPOINT_ROLLBACK );
  assert( iSavepoint>=0 || op==SAVEPOINT_ROLLBACK );

  if( rc==SQLITE_OK && iSavepoint<pPager->nSavepoint ){
    int ii;            /* Iterator variable */
    int nNew;          /* Number of remaining savepoints after this op. */

    /* Figure out how many savepoints will still be active after this
    ** operation. Store this value in nNew. Then free resources associated
    ** with any savepoints that are destroyed by this operation.
    */
    nNew = iSavepoint + (( op==SAVEPOINT_RELEASE ) ? 0 : 1);
    for(ii=nNew; ii<pPager->nSavepoint; ii++){
      sqlite3BitvecDestroy(pPager->aSavepoint[ii].pInSavepoint);
    }
    pPager->nSavepoint = nNew;

    /* Truncate the sub-journal so that it only includes the parts
    ** that are still in use. */
    if( op==SAVEPOINT_RELEASE ){
      PagerSavepoint *pRel = &pPager->aSavepoint[nNew];
      if( pRel->bTruncateOnRelease && isOpen(pPager->sjfd) ){
        /* Only truncate if it is an in-memory sub-journal. */
        if( sqlite3JournalIsInMemory(pPager->sjfd) ){
          i64 sz = (pPager->pageSize+4)*(i64)pRel->iSubRec;
          rc = sqlite3OsTruncate(pPager->sjfd, sz);
          assert( rc==SQLITE_OK );
        }
        pPager->nSubRec = pRel->iSubRec;
      }
    }
    /* Else this is a rollback operation, playback the specified savepoint.
    ** If this is a temp-file, it is possible that the journal file has
    ** not yet been opened. In this case there have been no changes to
    ** the database file, so the playback operation can be skipped.
    */
    else if( pagerUseWal(pPager) || isOpen(pPager->jfd) ){
      PagerSavepoint *pSavepoint = (nNew==0)?0:&pPager->aSavepoint[nNew-1];
      rc = pagerPlaybackSavepoint(pPager, pSavepoint);
      assert(rc!=SQLITE_DONE);
    }

#ifdef SQLITE_ENABLE_ZIPVFS
    /* If the cache has been modified but the savepoint cannot be rolled
    ** back journal_mode=off, put the pager in the error state. This way,
    ** if the VFS used by this pager includes ZipVFS, the entire transaction
    ** can be rolled back at the ZipVFS level.  */
    else if(
        pPager->journalMode==PAGER_JOURNALMODE_OFF
     && pPager->eState>=PAGER_WRITER_CACHEMOD
    ){
      pPager->errCode = SQLITE_ABORT;
      pPager->eState = PAGER_ERROR;
      setGetterMethod(pPager);
    }
#endif
  }

  return rc;
}